

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_file_dtype_parse(char *buffer,char *dtype,void *data,char *fmt)

{
  undefined1 *puVar1;
  char *pcVar2;
  char ndtype [8];
  char ndtype2 [8];
  char converted [128];
  char cStack_c8;
  undefined4 local_c7;
  char local_c0 [8];
  undefined1 local_b8 [4];
  undefined1 local_b4 [4];
  undefined1 local_b0 [128];
  
  _dtype_normalize(local_c0,dtype);
  local_c0[0] = '=';
  _dtype_normalize(&cStack_c8,local_c0);
  if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3161) {
    pcVar2 = "%c";
  }
  else if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3869) {
    pcVar2 = "%ld";
  }
  else if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3469) {
    pcVar2 = "%d";
  }
  else if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3875) {
    pcVar2 = "%lu";
  }
  else if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3475) {
    pcVar2 = "%u";
  }
  else if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3866) {
    pcVar2 = "%lf";
  }
  else {
    if (local_c7._2_1_ != '\0' || (short)local_c7 != 0x3466) {
      if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3863) {
        pcVar2 = "%f + %f I";
        if (fmt != (char *)0x0) {
          pcVar2 = fmt;
        }
        puVar1 = local_b4;
      }
      else {
        if (local_c7 != 0x363163) {
          return -1;
        }
        pcVar2 = "%lf + %lf I";
        if (fmt != (char *)0x0) {
          pcVar2 = fmt;
        }
        puVar1 = local_b0;
      }
      __isoc99_sscanf(buffer,pcVar2,local_b8,puVar1);
      goto LAB_001071ad;
    }
    pcVar2 = "%f";
  }
  if (fmt != (char *)0x0) {
    pcVar2 = fmt;
  }
  __isoc99_sscanf(buffer,pcVar2,local_b8);
LAB_001071ad:
  dtype_convert_simple(data,dtype,local_b8,&cStack_c8,1);
  return 0;
}

Assistant:

int
big_file_dtype_parse(const char * buffer, const char * dtype, void * data, const char * fmt)
{
    char ndtype[8];
    char ndtype2[8];
    variant_t p;

    /* handle the endianness stuff in case it is not machine */
    char converted[128];

    _dtype_normalize(ndtype2, dtype);
    ndtype2[0] = '=';
    _dtype_normalize(ndtype, ndtype2);

    p.v = converted;
#define PARSE1(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sscanf(buffer, fmt, p.dtype); \
    }
#define PARSE2(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sscanf(buffer, fmt, &p.dtype->r, &p.dtype->i); \
    }
    PARSE1(a1, "%c") else
    PARSE1(i8, "%ld") else
    PARSE1(i4, "%d") else
    PARSE1(u8, "%lu") else
    PARSE1(u4, "%u") else
    PARSE1(f8, "%lf") else
    PARSE1(f4, "%f") else
    PARSE2(c8, "%f + %f I") else
    PARSE2(c16, "%lf + %lf I") else
    return -1;

    dtype_convert_simple(data, dtype, converted, ndtype, 1);

    return 0;
}